

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso.c
# Opt level: O1

void Gia_IsoManStop(Gia_IsoMan_t *p)

{
  Vec_Int_t *pVVar1;
  
  pVVar1 = p->vClasses;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = p->vClasses2;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  if (p->pLevels != (int *)0x0) {
    free(p->pLevels);
    p->pLevels = (int *)0x0;
  }
  if (p->pUniques != (int *)0x0) {
    free(p->pUniques);
    p->pUniques = (int *)0x0;
  }
  if (p->pStoreW != (word *)0x0) {
    free(p->pStoreW);
    p->pStoreW = (word *)0x0;
  }
  if (p != (Gia_IsoMan_t *)0x0) {
    free(p);
    return;
  }
  return;
}

Assistant:

void Gia_IsoManStop( Gia_IsoMan_t * p )
{
    // class representation
    Vec_IntFree( p->vClasses );
    Vec_IntFree( p->vClasses2 );
    // internal data
    ABC_FREE( p->pLevels );
    ABC_FREE( p->pUniques );
    ABC_FREE( p->pStoreW );
    ABC_FREE( p );
}